

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O1

bool __thiscall Lodtalk::VMContext::isClassOrMetaclass(VMContext *this,Oop oop)

{
  uint uVar1;
  ClassTable *this_00;
  ClassDescription *pCVar2;
  size_t index;
  bool bVar3;
  
  index = 0x1c;
  if (((ulong)oop.field_0 & 1) == 0) {
    uVar1 = oop.field_0._0_4_ & 6;
    if (((uVar1 != 2) && (uVar1 != 4)) && ((uint)((ulong)*(undefined8 *)oop.field_0 >> 0x2a) == 0xc)
       ) {
      return true;
    }
    if (((ulong)oop.field_0 & 1) == 0) {
      uVar1 = oop.field_0._0_4_ & 6;
      if (uVar1 == 2) {
        index = 0x24;
      }
      else if (uVar1 == 4) {
        index = 0x20;
      }
      else {
        index = *(ulong *)oop.field_0 >> 0x2a;
      }
    }
  }
  this_00 = MemoryManager::getClassTable(this->memoryManager);
  pCVar2 = ClassTable::getClassFromIndex(this_00,index);
  if (((ulong)pCVar2 & 1) == 0) {
    uVar1 = (uint)pCVar2 & 6;
    bVar3 = false;
    if ((uVar1 != 2) && (bVar3 = false, uVar1 != 4)) {
      bVar3 = SUB84((pCVar2->super_Behavior).super_Object.super_ProtoObject.object_header_,4) >> 10
              == 0xc;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool VMContext::isClassOrMetaclass(Oop oop)
{
	auto classIndex = classIndexOf(oop);
	if(classIndex == SCI_Metaclass)
		return true;

	auto clazz = getClassFromIndex(classIndexOf(oop));
	return classIndexOf(clazz) == SCI_Metaclass;
}